

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O3

int __thiscall
ON_UuidPairList::GetId1s(ON_UuidPairList *this,ON_SimpleArray<ON_UUID_struct> *uuid_list)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ulong new_capacity;
  long lVar5;
  
  iVar1 = uuid_list->m_count;
  iVar3 = (this->super_ON_SimpleArray<ON_UuidPair>).m_count;
  new_capacity = (ulong)((iVar3 + iVar1) - this->m_removed_count);
  if ((ulong)(long)uuid_list->m_capacity < new_capacity) {
    ON_SimpleArray<ON_UUID_struct>::SetCapacity(uuid_list,new_capacity);
    iVar3 = (this->super_ON_SimpleArray<ON_UuidPair>).m_count;
  }
  if (0 < iVar3) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      bVar2 = ::operator==(&ON_max_uuid,
                           (ON_UUID_struct *)
                           (((this->super_ON_SimpleArray<ON_UuidPair>).m_a)->m_uuid[0].Data4 +
                           lVar5 + -8));
      if (bVar2) {
        bVar2 = ::operator==(&ON_max_uuid,
                             (ON_UUID_struct *)
                             (((this->super_ON_SimpleArray<ON_UuidPair>).m_a)->m_uuid[1].Data4 +
                             lVar5 + -8));
        if (!bVar2) goto LAB_003bd149;
      }
      else {
LAB_003bd149:
        ON_SimpleArray<ON_UUID_struct>::Append
                  (uuid_list,
                   (ON_UUID_struct *)
                   (((this->super_ON_SimpleArray<ON_UuidPair>).m_a)->m_uuid[0].Data4 + lVar5 + -8));
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x20;
    } while (lVar4 < (this->super_ON_SimpleArray<ON_UuidPair>).m_count);
  }
  return uuid_list->m_count - iVar1;
}

Assistant:

int ON_UuidPairList::GetId1s(
    ON_SimpleArray<ON_UUID>& uuid_list
    ) const
{
  const int count0 = uuid_list.Count();
  int i;
  uuid_list.Reserve(uuid_list.Count() + m_count - m_removed_count);
  for ( i = 0; i < m_count; i++ )
  {
    if ( ON_max_uuid == m_a[i].m_uuid[0] && ON_max_uuid == m_a[i].m_uuid[1] )
      continue;
    uuid_list.Append(m_a[i].m_uuid[0]);
  }
  return uuid_list.Count() - count0;
}